

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

void __thiscall ObjectFile::discardAttributes(ObjectFile *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  MutexLocker lock;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  cleanUp;
  MutexLocker local_50;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  local_40;
  
  MutexLocker::MutexLocker(&local_50,this->objectMutex);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::_Rb_tree(&local_40,&(this->attributes)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::clear(&(this->attributes)._M_t);
  for (p_Var1 = local_40._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_40._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
      p_Var1[1]._M_parent = (_Base_ptr)0x0;
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::~_Rb_tree(&local_40);
  MutexLocker::~MutexLocker(&local_50);
  return;
}

Assistant:

void ObjectFile::discardAttributes()
{
	MutexLocker lock(objectMutex);

	std::map<CK_ATTRIBUTE_TYPE, OSAttribute*> cleanUp = attributes;
	attributes.clear();

	for (std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		if (i->second == NULL)
		{
			continue;
		}

		delete i->second;
		i->second = NULL;
	}
}